

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O3

void __thiscall HN::State::requestJSONForURI(State *this,string *uri)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  snprintf(this->curURI,0x200,"%s",(uri->_M_dataplus)._M_p);
  local_30._M_dataplus._M_p = (uri->_M_dataplus)._M_p;
  paVar1 = &uri->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == paVar1) {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_30.field_2._8_8_ = *(undefined8 *)((long)&uri->field_2 + 8);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_30._M_string_length = uri->_M_string_length;
  (uri->_M_dataplus)._M_p = (pointer)paVar1;
  uri->_M_string_length = 0;
  (uri->field_2)._M_local_buf[0] = '\0';
  requestJSONForURI_impl(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void State::requestJSONForURI(std::string uri) {
        snprintf(curURI, 512, "%s", uri.c_str());

        requestJSONForURI_impl(std::move(uri));
    }